

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitTableSet(PrintExpressionContents *this,TableSet *curr)

{
  string_view str;
  
  str._M_str = "table.set ";
  str._M_len = 10;
  printMedium(this->o,str);
  Name::print(&curr->table,this->o);
  return;
}

Assistant:

void visitTableSet(TableSet* curr) {
    printMedium(o, "table.set ");
    curr->table.print(o);
  }